

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O0

string * __thiscall
phosg::join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char_const*>
          (string *__return_storage_ptr__,phosg *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *items,char **delim)

{
  bool bVar1;
  reference __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  const_iterator __end0;
  const_iterator __begin0;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  char **delim_local;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *items_local;
  string *ret;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((const_iterator *)&__end0._M_node,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)this);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((const_iterator *)&item,
        (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)this);
  while (bVar1 = ::std::operator==((_Self *)&__end0._M_node,(_Self *)&item),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __str = ::std::
            _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                         *)&__end0._M_node);
    bVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (__return_storage_ptr__);
    if (!bVar1) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,
                 (char *)(items->
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Deque_impl_data._M_map);
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,__str);
    ::std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)&__end0._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const ItemContainerT& items, DelimiterT& delim) {
  std::string ret;
  for (const auto& item : items) {
    if (!ret.empty()) {
      ret += delim;
    }
    ret += item;
  }
  return ret;
}